

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O2

void nghttp3_qpack_decoder_init
               (nghttp3_qpack_decoder *decoder,size_t hard_max_dtable_capacity,
               size_t max_blocked_streams,nghttp3_mem *mem)

{
  qpack_context_init(&decoder->ctx,hard_max_dtable_capacity,max_blocked_streams,mem);
  decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
  decoder->opcode = NGHTTP3_QPACK_ES_OPCODE_INSERT_INDEXED;
  decoder->written_icnt = 0;
  decoder->max_concurrent_streams = 0;
  decoder->uninterrupted_encoderlen = 0;
  nghttp3_qpack_read_state_reset(&decoder->rstate);
  nghttp3_buf_init(&decoder->dbuf);
  return;
}

Assistant:

void nghttp3_qpack_decoder_init(nghttp3_qpack_decoder *decoder,
                                size_t hard_max_dtable_capacity,
                                size_t max_blocked_streams,
                                const nghttp3_mem *mem) {
  qpack_context_init(&decoder->ctx, hard_max_dtable_capacity,
                     max_blocked_streams, mem);

  decoder->state = NGHTTP3_QPACK_ES_STATE_OPCODE;
  decoder->opcode = 0;
  decoder->written_icnt = 0;
  decoder->max_concurrent_streams = 0;
  decoder->uninterrupted_encoderlen = 0;

  nghttp3_qpack_read_state_reset(&decoder->rstate);
  nghttp3_buf_init(&decoder->dbuf);
}